

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  char buffer [1024];
  char *local_448;
  int *local_440;
  char local_438;
  undefined1 uStack_437;
  char cStack_436;
  undefined4 uStack_435;
  unkbyte9 Stack_431;
  undefined7 uStack_428;
  
  iVar4 = stbi__hdr_test(s);
  if ((iVar4 != 0) && (stbi__hdr_gettoken(s,&local_438), local_438 != '\0')) {
    bVar2 = false;
    local_440 = comp;
    do {
      auVar7[1] = uStack_437;
      auVar7[0] = local_438;
      auVar7[2] = cStack_436;
      auVar7._3_4_ = uStack_435;
      auVar7._7_9_ = Stack_431;
      auVar1._9_7_ = uStack_428;
      auVar1._0_9_ = Stack_431;
      auVar7 = vpternlogq_avx512vl(s_FORMAT_32_bit_rl32_bit_rle_rgbe_0046a790._0_16_ ^ auVar7,
                                   s_FORMAT_32_bit_rl32_bit_rle_rgbe_0046a790._16_16_,auVar1,0xf6);
      if (auVar7 == (undefined1  [16])0x0) {
        bVar2 = true;
      }
      stbi__hdr_gettoken(s,&local_438);
    } while (local_438 != '\0');
    if ((bVar2) &&
       (local_448 = &local_438, stbi__hdr_gettoken(s,&local_438),
       cStack_436 == ' ' && CONCAT11(uStack_437,local_438) == 0x592d)) {
      local_448 = (char *)&uStack_435;
      lVar5 = strtol(local_448,&local_448,10);
      piVar3 = local_440;
      if (y != (int *)0x0) {
        *y = (int)lVar5;
      }
      local_448 = local_448 + -1;
      do {
        pcVar6 = local_448;
        local_448 = pcVar6 + 1;
      } while (pcVar6[1] == ' ');
      iVar4 = strncmp(local_448,"+X ",3);
      if (iVar4 == 0) {
        local_448 = pcVar6 + 4;
        lVar5 = strtol(local_448,(char **)0x0,10);
        if (x != (int *)0x0) {
          *x = (int)lVar5;
        }
        if (piVar3 == (int *)0x0) {
          return 1;
        }
        *piVar3 = 3;
        return 1;
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int dummy;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}